

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_history.cpp
# Opt level: O1

void __thiscall undo::UndoHistory::undo(UndoHistory *this)

{
  UndoState *pUVar1;
  
  pUVar1 = this->m_cur;
  if (pUVar1 == (UndoState *)0x0) {
    __assert_fail("m_cur",
                  "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/undo_history.cpp",
                  0x2d,"void undo::UndoHistory::undo()");
  }
  if (pUVar1 != this->m_first) {
    if (pUVar1->m_prev != (UndoState *)0x0) goto LAB_001017cc;
    if (pUVar1 != this->m_first) goto LAB_001017f4;
  }
  if (pUVar1->m_prev != (UndoState *)0x0) {
LAB_001017f4:
    __assert_fail("(m_cur != m_first && m_cur->m_prev) || (m_cur == m_first && !m_cur->m_prev)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]undo/undo_history.cpp",
                  0x33,"void undo::UndoHistory::undo()");
  }
LAB_001017cc:
  moveTo(this,pUVar1->m_prev);
  return;
}

Assistant:

void UndoHistory::undo()
{
  assert(m_cur);
  if (!m_cur)
    return;

  assert(
    (m_cur != m_first && m_cur->m_prev) ||
    (m_cur == m_first && !m_cur->m_prev));

  moveTo(m_cur->m_prev);
}